

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O1

void anon_unknown.dwarf_568a9::checkDeepTypesFailToLoad(char *file)

{
  int iVar1;
  DeepTiledInputFile f;
  DeepTiledInputPart p;
  DeepTiledInputFile aDStack_38 [40];
  
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::DeepTiledInputFile::DeepTiledInputFile(aDStack_38,file,iVar1);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                ,0xad,"void (anonymous namespace)::checkDeepTypesFailToLoad(const char *)");
}

Assistant:

void
checkDeepTypesFailToLoad (const char* file)
{
    bool caught = false;

    // trying to open it as a deep tiled file should fail

    try
    {
        caught = false;
        DeepTiledInputFile f (file);
        assert (false);
    }
    catch (...)
    {
        caught = true;
    }
    assert (caught);

    // trying to open it as a deep tiled part of a multipart file should fail
    try
    {
        caught = false;
        MultiPartInputFile multiin (file);
        DeepTiledInputPart p (multiin, 0);
        assert (false);
    }
    catch (...)
    {
        caught = true;
    }
    assert (caught);

    // trying to open it as a deep scanline file should fail
    try
    {
        caught = false;
        DeepScanLineInputFile f (file);
        assert (false);
    }
    catch (...)
    {
        caught = true;
    }
    assert (caught);

    // trying to open it as a deep scanline part of a multipart file should fail
    try
    {
        caught = false;
        MultiPartInputFile    multiin (file);
        DeepScanLineInputPart p (multiin, 0);
        assert (false);
    }
    catch (...)
    {
        caught = true;
    }
    assert (caught);
}